

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O0

void bench_ecmult_wnaf(void *arg,int iters)

{
  int iVar1;
  int in_ESI;
  secp256k1_scalar *unaff_retaddr;
  bench_inv *data;
  int overflow;
  int bits;
  int i;
  int local_18;
  int local_14;
  int local_10;
  
  local_14 = 0;
  local_18 = 0;
  for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
    iVar1 = secp256k1_ecmult_wnaf((int *)arg,iters,_overflow,data._4_4_);
    local_14 = iVar1 + local_14;
    iVar1 = secp256k1_scalar_add
                      (_overflow,(secp256k1_scalar *)CONCAT44(data._4_4_,data._0_4_),unaff_retaddr);
    local_18 = iVar1 + local_18;
  }
  if (local_18 < 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/bench_internal.c"
            ,0x153,"test condition failed: overflow >= 0");
    abort();
  }
  if (in_ESI * 0x100 < local_14) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/bench_internal.c"
            ,0x154,"test condition failed: bits <= 256*iters");
    abort();
  }
  return;
}

Assistant:

static void bench_ecmult_wnaf(void* arg, int iters) {
    int i, bits = 0, overflow = 0;
    bench_inv *data = (bench_inv*)arg;

    for (i = 0; i < iters; i++) {
        bits += secp256k1_ecmult_wnaf(data->wnaf, 256, &data->scalar[0], WINDOW_A);
        overflow += secp256k1_scalar_add(&data->scalar[0], &data->scalar[0], &data->scalar[1]);
    }
    CHECK(overflow >= 0);
    CHECK(bits <= 256*iters);
}